

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

_Bool al_drop_next_event(ALLEGRO_EVENT_QUEUE *queue)

{
  ALLEGRO_EVENT *event;
  
  heartbeat();
  _al_mutex_lock(&queue->mutex);
  event = get_next_event_if_any(queue,true);
  if (event != (ALLEGRO_EVENT *)0x0) {
    unref_if_user_event(event);
  }
  _al_mutex_unlock(&queue->mutex);
  return event != (ALLEGRO_EVENT *)0x0;
}

Assistant:

bool al_drop_next_event(ALLEGRO_EVENT_QUEUE *queue)
{
   ALLEGRO_EVENT *next_event;
   ASSERT(queue);

   heartbeat();

   _al_mutex_lock(&queue->mutex);

   next_event = get_next_event_if_any(queue, true);
   if (next_event) {
      unref_if_user_event(next_event);
   }

   _al_mutex_unlock(&queue->mutex);

   return (next_event ? true : false);
}